

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O0

string * __thiscall
iDynTree::ExternalMesh::getFileLocationOnLocalFileSystem_abi_cxx11_(ExternalMesh *this)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ulong uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  string *psVar4;
  char *pcVar5;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar6;
  istream *piVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  anon_class_2_2_096a8fa6 getFilePath;
  anon_class_1_0_00000001_for_isFileExisting isFileExisting;
  anon_class_1_1_43797099_for_cleanPathSeparator cleanPathSeparator;
  string individualPath_1;
  stringstream env_var_string_1;
  char *env_var_value_1;
  size_t i_1;
  string individualPath;
  stringstream env_var_string;
  char *env_var_value;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListPrefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListShare;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathList;
  bool isWindows;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8c8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8d0;
  value_type *in_stack_fffffffffffff8d8;
  hasher *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffff8f0;
  undefined7 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8ff;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  _Ios_Openmode in_stack_fffffffffffff90c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  string *in_stack_fffffffffffff9b0;
  string *in_stack_fffffffffffff9b8;
  string *local_638;
  string *local_608;
  allocator<char> local_5a9;
  string local_5a8 [37];
  byte local_583;
  byte local_581;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_580;
  undefined1 local_578;
  string local_570 [32];
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [32];
  stringstream local_508 [392];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  ulong local_378;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_370;
  undefined1 local_368;
  string local_360 [39];
  undefined1 local_339 [33];
  stringstream local_318 [392];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_190;
  string *local_188;
  undefined1 local_17a;
  allocator<char> local_179;
  string *local_178;
  string local_170 [32];
  string *local_150;
  undefined8 local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  string *local_120;
  string local_118 [32];
  undefined1 local_f8 [32];
  string *local_d8;
  undefined8 local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b [2];
  byte local_11;
  
  local_11 = 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x46945f);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff8e0);
  if (bVar2) {
    local_123 = 1;
    local_120 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff910,
               (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (allocator<char> *)in_stack_fffffffffffff900._M_current);
    local_120 = (string *)local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff910,
               (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (allocator<char> *)in_stack_fffffffffffff900._M_current);
    local_123 = 0;
    local_d8 = local_118;
    local_d0 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x46963b);
    __l._M_array._4_4_ = in_stack_fffffffffffff90c;
    __l._M_array._0_4_ = in_stack_fffffffffffff908;
    __l._M_len = (size_type)in_stack_fffffffffffff910;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff900._M_current,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x46966f);
    local_608 = (string *)&local_d8;
    do {
      local_608 = local_608 + -0x20;
      std::__cxx11::string::~string(local_608);
    } while (local_608 != local_118);
    std::allocator<char>::~allocator(&local_122);
    std::allocator<char>::~allocator(&local_121);
    local_17a = 1;
    local_178 = local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff910,
               (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (allocator<char> *)in_stack_fffffffffffff900._M_current);
    local_17a = 0;
    local_150 = local_170;
    local_148 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x469767);
    __l_00._M_array._4_4_ = in_stack_fffffffffffff90c;
    __l_00._M_array._0_4_ = in_stack_fffffffffffff908;
    __l_00._M_len = (size_type)in_stack_fffffffffffff910;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff900._M_current,__l_00,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x46979b);
    local_638 = (string *)&local_150;
    do {
      in_stack_fffffffffffff9b8 = local_638 + -0x20;
      std::__cxx11::string::~string(in_stack_fffffffffffff9b8);
      local_638 = in_stack_fffffffffffff9b8;
    } while (in_stack_fffffffffffff9b8 != local_170);
    std::allocator<char>::~allocator(&local_179);
    local_188 = (string *)0x0;
    while( true ) {
      in_stack_fffffffffffff9b0 = local_188;
      psVar4 = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_c8);
      if (psVar4 <= in_stack_fffffffffffff9b0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_c8,(size_type)local_188);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      puVar6 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)getenv(pcVar5);
      local_190 = puVar6;
      if (puVar6 != (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
        in_stack_fffffffffffff9a8 = (string *)local_339;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff910,
                   (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (allocator<char> *)in_stack_fffffffffffff900._M_current);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_318,(string *)(local_339 + 1),_Var3);
        std::__cxx11::string::~string((string *)(local_339 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_339);
        std::__cxx11::string::string(local_360);
        in_stack_fffffffffffff9a0 = puVar6;
        while( true ) {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_318,local_360,local_11 & 1 | 0x3a);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          if (!bVar2) break;
          pVar9 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
          local_370._M_cur =
               (__node_type *)
               pVar9.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_368 = pVar9.second;
        }
        std::__cxx11::string::~string(local_360);
        std::__cxx11::stringstream::~stringstream(local_318);
      }
      local_188 = (string *)&local_188->field_0x1;
    }
    local_378 = 0;
    while( true ) {
      uVar1 = local_378;
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_140);
      if (sVar8 <= uVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_140,local_378);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getenv(pcVar5);
      local_380 = this_00;
      if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (allocator<char> *)in_stack_fffffffffffff900._M_current);
        in_stack_fffffffffffff90c = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_508,local_528,in_stack_fffffffffffff90c);
        std::__cxx11::string::~string(local_528);
        std::allocator<char>::~allocator(&local_529);
        std::__cxx11::string::string(local_550);
        in_stack_fffffffffffff910 = this_00;
        while( true ) {
          in_stack_fffffffffffff900._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_508,local_550,local_11 & 1 | 0x3a);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)(&(in_stack_fffffffffffff900._M_current)->_M_dataplus +
                                    *(long *)(*(long *)in_stack_fffffffffffff900._M_current + -0x18)
                                    ));
          if (!bVar2) break;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar2,in_stack_fffffffffffff8f8),
                         (char *)in_stack_fffffffffffff8f0._M_cur);
          pVar9 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
          in_stack_fffffffffffff8f0._M_cur =
               (__node_type *)
               pVar9.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_578 = pVar9.second;
          local_580._M_cur = in_stack_fffffffffffff8f0._M_cur;
          std::__cxx11::string::~string(local_570);
        }
        std::__cxx11::string::~string(local_550);
        std::__cxx11::stringstream::~stringstream(local_508);
      }
      local_378 = local_378 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8e0);
  }
  else {
    local_9b[0]._M_h._11_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffff8c8);
    local_9b[0]._M_h._3_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffff8c8);
    puVar6 = local_9b;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x4694c9);
    __last._M_current._7_1_ = in_stack_fffffffffffff8ff;
    __last._M_current._0_7_ = in_stack_fffffffffffff8f8;
    std::
    unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    unordered_set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff8f0._M_cur,in_stack_fffffffffffff900,__last,
               CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
               in_stack_fffffffffffff8e0,(key_equal *)in_stack_fffffffffffff8d8,
               (allocator_type *)in_stack_fffffffffffff910);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffff8d0,puVar6);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x46952c);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x469539);
  }
  local_583 = local_11 & 1;
  local_581 = local_583;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff910,
             (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
             (allocator<char> *)in_stack_fffffffffffff900._M_current);
  getFileLocationOnLocalFileSystem::anon_class_2_2_096a8fa6::operator()
            ((anon_class_2_2_096a8fa6 *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x469fef);
  return in_RDI;
}

Assistant:

std::string ExternalMesh::getFileLocationOnLocalFileSystem() const
    {
        bool isWindows = false;
    #ifdef _WIN32
        isWindows = true;
    #endif

        std::unordered_set<std::string> pathList;

        // if the user provides the packageDirs we do not check inside the dirs listed in the
        // environment variables
        if (!this->packageDirs.empty())
        {
            pathList = std::unordered_set<std::string>(this->packageDirs.begin(),
                                                       this->packageDirs.end());
        } else {
            // List of variables that contain <prefix>/share paths
            std::vector<std::string> envListShare = {"GAZEBO_MODEL_PATH", "ROS_PACKAGE_PATH"};
            // List of variables that contains <prefix> paths (to which /share needs to be added)
            std::vector<std::string> envListPrefix = {"AMENT_PREFIX_PATH"};

            for (size_t i = 0; i < envListShare.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListShare[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath);
                    }
                }
            }

            for (size_t i = 0; i < envListPrefix.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListPrefix[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath + "/share");
                    }
                }
            }
        }
        auto cleanPathSeparator = [isWindows](const std::string& filename)->std::string
        {
            std::string output = filename;
            char pathSeparator = isWindows ? '\\' : '/';
            char wrongPathSeparator = isWindows ? '/' : '\\';

            for (size_t i = 0; i < output.size(); ++i)
            {
                if (output[i] == wrongPathSeparator)
                {
                    output[i] = pathSeparator;
                }
            }

            return output;

        };

        auto isFileExisting = [](const std::string& filename)->bool
        {
            if (FILE *file = fopen(filename.c_str(), "r")) {
                fclose(file);
                return true;
            } else {
                return false;
            }
        };

        auto getFilePath = [isFileExisting, cleanPathSeparator](const std::string& filename, const std::string& prefixToRemove, const std::unordered_set<std::string>& paths)
        {
            if(isFileExisting(filename))
            {
                return filename;
            }

            if (filename.substr(0, prefixToRemove.size()) == prefixToRemove)
            {
                std::string filename_noprefix = filename;
                filename_noprefix.erase(0, prefixToRemove.size());
                for (const std::string& path : paths)
                {
                    const std::string testPath  = cleanPathSeparator(path + filename_noprefix);
                    if (isFileExisting(testPath))
                    {
                        return testPath;
                    }
                }

            }

            return filename; //By default return the input;
        };

        return getFilePath(filename, "package:/", pathList);
    }